

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabImportErrmsg(Vdbe *p,sqlite3_vtab *pVtab)

{
  char *pcVar1;
  sqlite3 *in_RSI;
  sqlite3 *in_RDI;
  sqlite3 *db;
  
  if (in_RSI->pDfltColl != (CollSeq *)0x0) {
    sqlite3DbFree(in_RSI,in_RDI->pVfs);
    pcVar1 = sqlite3DbStrDup(in_RDI,(char *)in_RSI);
    *(char **)(in_RDI->aLimit + 8) = pcVar1;
    sqlite3_free((void *)0x17281a);
    in_RSI->pDfltColl = (CollSeq *)0x0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabImportErrmsg(Vdbe *p, sqlite3_vtab *pVtab){
  if( pVtab->zErrMsg ){
    sqlite3 *db = p->db;
    sqlite3DbFree(db, p->zErrMsg);
    p->zErrMsg = sqlite3DbStrDup(db, pVtab->zErrMsg);
    sqlite3_free(pVtab->zErrMsg);
    pVtab->zErrMsg = 0;
  }
}